

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O0

int saisxx_private::
    computeBWT<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> T,
              __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA,
              __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> C,
              __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> B,long n,long k)

{
  long lVar1;
  bool bVar2;
  reference plVar3;
  ulong *puVar4;
  ulong uVar5;
  difference_type dVar6;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *this;
  ulong local_128;
  ulong local_100;
  ulong local_e0;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_a8;
  long *local_a0;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_98;
  long *local_90;
  long local_88;
  long *local_80;
  long *local_78;
  long *local_70;
  long local_68;
  char_type c1;
  char_type c0;
  long pidx;
  long j;
  long i;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> b;
  long k_local;
  long n_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> B_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> C_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> T_local;
  
  b._M_current = (long *)k;
  n_local = (long)B._M_current;
  B_local = C;
  C_local = SA;
  SA_local = T;
  __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::__normal_iterator
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)&i);
  c0 = -1;
  bVar2 = __gnu_cxx::operator==
                    (&B_local,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)&n_local);
  if (bVar2) {
    local_70 = SA_local._M_current;
    local_78 = B_local._M_current;
    getCounts<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (SA_local,B_local,n,(long)b._M_current);
  }
  local_80 = B_local._M_current;
  local_88 = n_local;
  getBuckets<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
            (B_local,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)n_local,
             (long)b._M_current,false);
  pidx = n + -1;
  plVar3 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
           operator[](&SA_local,pidx);
  local_68 = *plVar3;
  plVar3 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
           operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                      &n_local,local_68);
  local_90 = (long *)__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                     ::operator+(&C_local,*plVar3);
  i = (long)local_90;
  if ((pidx < 1) ||
     (plVar3 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[](&SA_local,pidx + -1), local_68 <= *plVar3)) {
    local_e0 = pidx;
  }
  else {
    local_e0 = pidx ^ 0xffffffffffffffff;
  }
  local_98 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator++((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)&i,0
                       );
  puVar4 = (ulong *)__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                    ::operator*(&local_98);
  *puVar4 = local_e0;
  for (j = 0; j < n; j = j + 1) {
    puVar4 = (ulong *)__gnu_cxx::
                      __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                      operator[](&C_local,j);
    pidx = *puVar4;
    if (pidx < 1) {
      if (pidx != 0) {
        uVar5 = pidx ^ 0xffffffffffffffff;
        puVar4 = (ulong *)__gnu_cxx::
                          __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                          operator[](&C_local,j);
        *puVar4 = uVar5;
      }
    }
    else {
      pidx = pidx - 1;
      puVar4 = (ulong *)__gnu_cxx::
                        __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                        operator[](&SA_local,pidx);
      c1 = *puVar4;
      uVar5 = c1 ^ 0xffffffffffffffff;
      puVar4 = (ulong *)__gnu_cxx::
                        __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                        operator[](&C_local,j);
      *puVar4 = uVar5;
      if (c1 != local_68) {
        dVar6 = __gnu_cxx::operator-
                          ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &i,&C_local);
        plVar3 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                            &n_local,local_68);
        *plVar3 = dVar6;
        local_68 = c1;
        plVar3 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                            &n_local,c1);
        local_a0 = (long *)__gnu_cxx::
                           __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                           operator+(&C_local,*plVar3);
        i = (long)local_a0;
      }
      if ((pidx < 1) ||
         (plVar3 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                   operator[](&SA_local,pidx + -1), local_68 <= *plVar3)) {
        local_100 = pidx;
      }
      else {
        local_100 = pidx ^ 0xffffffffffffffff;
      }
      local_a8 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator++((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                            &i,0);
      puVar4 = (ulong *)__gnu_cxx::
                        __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                        operator*(&local_a8);
      *puVar4 = local_100;
    }
  }
  bVar2 = __gnu_cxx::operator==
                    (&B_local,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)&n_local);
  if (bVar2) {
    getCounts<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (SA_local,B_local,n,(long)b._M_current);
  }
  getBuckets<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
            (B_local,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)n_local,
             (long)b._M_current,true);
  j = n + -1;
  local_68 = 0;
  plVar3 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
           operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                      &n_local,0);
  i = (long)__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
            operator+(&C_local,*plVar3);
  for (; -1 < j; j = j + -1) {
    puVar4 = (ulong *)__gnu_cxx::
                      __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                      operator[](&C_local,j);
    pidx = *puVar4;
    if (pidx < 1) {
      if (pidx == 0) {
        c0 = j;
      }
      else {
        uVar5 = pidx ^ 0xffffffffffffffff;
        puVar4 = (ulong *)__gnu_cxx::
                          __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                          operator[](&C_local,j);
        *puVar4 = uVar5;
      }
    }
    else {
      pidx = pidx - 1;
      plVar3 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[](&SA_local,pidx);
      lVar1 = *plVar3;
      c1 = lVar1;
      plVar3 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[](&C_local,j);
      *plVar3 = lVar1;
      if (c1 != local_68) {
        dVar6 = __gnu_cxx::operator-
                          ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &i,&C_local);
        plVar3 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                            &n_local,local_68);
        *plVar3 = dVar6;
        local_68 = c1;
        plVar3 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                            &n_local,c1);
        i = (long)__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator+(&C_local,*plVar3);
      }
      if ((pidx < 1) ||
         (plVar3 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                   operator[](&SA_local,pidx + -1), *plVar3 <= local_68)) {
        local_128 = pidx;
      }
      else {
        puVar4 = (ulong *)__gnu_cxx::
                          __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                          operator[](&SA_local,pidx + -1);
        local_128 = *puVar4 ^ 0xffffffffffffffff;
      }
      this = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator--((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)&i);
      puVar4 = (ulong *)__gnu_cxx::
                        __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                        operator*(this);
      *puVar4 = local_128;
    }
  }
  return (int)c0;
}

Assistant:

int
computeBWT(string_type T, sarray_type SA, bucket_type C, bucket_type B,
           index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j, pidx = -1;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    if(0 < (j = SA[i])) {
      SA[i] = ~(c0 = T[--j]);
      if(c0 != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    } else if(j != 0) {
      SA[i] = ~j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      SA[i] = (c0 = T[--j]);
      if(c0 != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((0 < j) && (T[j - 1] > c1)) ? ~((index_type)T[j - 1]) : j;
    } else if(j != 0) {
      SA[i] = ~j;
    } else {
      pidx = i;
    }
  }
  return pidx;
}